

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O3

void init_test(void)

{
  size_t *psVar1;
  fdb_kvs_handle *handle;
  fdb_status fVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  fdb_kvs_handle *fconfig_00;
  fdb_config *pfVar6;
  size_t metalen;
  size_t bodylen;
  uint uVar7;
  ulong unaff_RBP;
  char *pcVar8;
  fdb_doc *pfVar9;
  fdb_kvs_handle **unaff_R12;
  fdb_file_handle **ptr_fhandle;
  ulong uVar10;
  fdb_kvs_handle *unaff_R13;
  fdb_config *pfVar11;
  char *unaff_R15;
  char *kvs_config_00;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_config fconfig;
  fdb_doc *pfStack_118f0;
  fdb_kvs_handle *pfStack_118e8;
  fdb_file_handle *pfStack_118e0;
  timeval tStack_118d8;
  fdb_kvs_config fStack_118c8;
  fdb_config fStack_118b0;
  char acStack_117b8 [256];
  char *pcStack_116b8;
  fdb_config *pfStack_116b0;
  fdb_config *pfStack_116a8;
  fdb_file_handle *pfStack_11698;
  fdb_kvs_handle *pfStack_11690;
  fdb_kvs_config fStack_11688;
  timeval tStack_11670;
  char acStack_11660 [264];
  fdb_config fStack_11558;
  char acStack_11460 [256];
  char acStack_11360 [264];
  char *pcStack_11258;
  fdb_file_handle **ppfStack_11250;
  fdb_kvs_handle *pfStack_11248;
  fdb_config *pfStack_11240;
  fdb_kvs_config *pfStack_11238;
  code *pcStack_11230;
  fdb_kvs_handle *pfStack_11218;
  fdb_file_handle *pfStack_11210;
  fdb_iterator *pfStack_11208;
  timeval tStack_11200;
  fdb_kvs_config fStack_111f0;
  fdb_file_handle *apfStack_111d8 [32];
  fdb_config fStack_110d8;
  fdb_config fStack_10fd0;
  char acStack_10ed8 [264];
  fdb_config *pfStack_10dd0;
  fdb_kvs_handle **ppfStack_10dc8;
  fdb_kvs_handle *pfStack_10dc0;
  fdb_config *pfStack_10db8;
  char *pcStack_10db0;
  code *pcStack_10da8;
  fdb_file_handle *pfStack_10d98;
  fdb_kvs_handle *pfStack_10d90;
  fdb_doc *pfStack_10d88;
  undefined1 auStack_10d80 [40];
  fdb_seqnum_t fStack_10d58;
  uint64_t uStack_10d50;
  void *pvStack_10d48;
  fdb_config *pfStack_10d40;
  uint64_t uStack_10d38;
  fdb_kvs_config fStack_10d30;
  timeval tStack_10d18;
  undefined1 auStack_10d08 [72];
  fdb_config fStack_10cc0;
  char acStack_10bc0 [256];
  fdb_config fStack_10ac0;
  fdb_config *pfStack_109c8;
  fdb_config *pfStack_109c0;
  fdb_doc *pfStack_109a8;
  fdb_kvs_handle *pfStack_109a0;
  fdb_file_handle *pfStack_10998;
  fdb_doc *pfStack_10990;
  undefined1 auStack_10988 [40];
  fdb_seqnum_t fStack_10960;
  uint64_t uStack_10958;
  fdb_compaction_callback p_Stack_10950;
  fdb_config *pfStack_10948;
  void *pvStack_10940;
  fdb_kvs_config fStack_10930;
  timeval tStack_10918;
  uint8_t auStack_10908 [256];
  fdb_config fStack_10808;
  fdb_config fStack_10708;
  fdb_config *pfStack_10610;
  fdb_config *pfStack_10608;
  fdb_file_handle *pfStack_105f8;
  fdb_kvs_handle *pfStack_105f0;
  size_t sStack_105e8;
  int *piStack_105e0;
  timeval tStack_105d8;
  fdb_config fStack_105c8;
  fdb_kvs_handle *pfStack_104d0;
  fdb_file_handle *pfStack_104c8;
  int iStack_104bc;
  fdb_kvs_handle *pfStack_104b8;
  fdb_kvs_config fStack_104b0;
  timeval tStack_10498;
  undefined1 auStack_10488 [76];
  int iStack_1043c;
  docio_handle *pdStack_10438;
  uint64_t uStack_103d0;
  fdb_config fStack_10348;
  fdb_kvs_handle *pfStack_10240;
  fdb_kvs_handle *pfStack_10210;
  fdb_file_handle *pfStack_10208;
  size_t sStack_10200;
  void *pvStack_101f8;
  fdb_kvs_config fStack_101f0;
  timeval tStack_101d8;
  fdb_kvs_handle afStack_101c8 [126];
  undefined1 uStack_151;
  fdb_config *pfStack_148;
  fdb_file_handle *local_138;
  fdb_kvs_handle *local_130;
  fdb_kvs_config local_128;
  timeval local_110;
  fdb_config local_100;
  
  gettimeofday(&local_110,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  system("rm -rf  dummy* > errorlog.txt");
  fVar2 = fdb_init(&local_100);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_open(&local_138,"./dummy1",&local_100);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010fe7e;
    fVar2 = fdb_kvs_open_default(local_138,&local_130,&local_128);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010fe83;
    fVar2 = fdb_close(local_138);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010fe88;
    fVar2 = fdb_shutdown();
    if (fVar2 == FDB_RESULT_SUCCESS) {
      memleak_end();
      pcVar8 = "%s PASSED\n";
      if (init_test()::__test_pass != '\0') {
        pcVar8 = "%s FAILED\n";
      }
      fprintf(_stderr,pcVar8,"init test");
      return;
    }
  }
  else {
    init_test();
LAB_0010fe7e:
    init_test();
LAB_0010fe83:
    init_test();
LAB_0010fe88:
    init_test();
  }
  init_test();
  pfStack_148 = &local_100;
  gettimeofday(&tStack_101d8,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_kvs_config();
  fconfig_00 = afStack_101c8;
  fdb_get_default_config();
  afStack_101c8[0].kvs_config.create_if_missing = true;
  afStack_101c8[0].kvs_config._1_1_ = 0;
  system("rm -rf  dummy* > errorlog.txt");
  memset(&afStack_101c8[0].config.num_bgflusher_threads,0x61,0xff80);
  uStack_151 = 0;
  fVar2 = fdb_open(&pfStack_10208,"./dummy1",(fdb_config *)fconfig_00);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_kvs_open_default(pfStack_10208,&pfStack_10210,&fStack_101f0);
    handle = pfStack_10210;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010fff5;
    psVar1 = &afStack_101c8[0].config.num_bgflusher_threads;
    sVar4 = strlen((char *)psVar1);
    fVar2 = fdb_set_kv(handle,psVar1,sVar4,(void *)0x0,0);
    fconfig_00 = handle;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010fffa;
    fVar2 = fdb_get(pfStack_10210,(fdb_doc *)0x0);
    if (fVar2 != FDB_RESULT_INVALID_ARGS) goto LAB_0010ffff;
    psVar1 = &afStack_101c8[0].config.num_bgflusher_threads;
    sVar4 = strlen((char *)psVar1);
    fVar2 = fdb_get_kv(pfStack_10210,psVar1,sVar4,&pvStack_101f8,&sStack_10200);
    fconfig_00 = pfStack_10210;
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fdb_close(pfStack_10208);
      fdb_shutdown();
      memleak_end();
      pcVar8 = "%s PASSED\n";
      if (set_get_max_keylen()::__test_pass != '\0') {
        pcVar8 = "%s FAILED\n";
      }
      fprintf(_stderr,pcVar8,"set get max keylen");
      return;
    }
  }
  else {
    set_get_max_keylen();
LAB_0010fff5:
    set_get_max_keylen();
LAB_0010fffa:
    set_get_max_keylen();
LAB_0010ffff:
    set_get_max_keylen();
  }
  pfVar11 = (fdb_config *)&afStack_101c8[0].config.num_bgflusher_threads;
  set_get_max_keylen();
  pfStack_104d0 = (fdb_kvs_handle *)0x110026;
  pfStack_10240 = fconfig_00;
  gettimeofday(&tStack_10498,(__timezone_ptr_t)0x0);
  pfStack_104d0 = (fdb_kvs_handle *)0x11002b;
  memleak_start();
  pfStack_104d0 = (fdb_kvs_handle *)0x110037;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_104d0 = (fdb_kvs_handle *)0x11003c;
  sVar5 = fdb_get_buffer_cache_used();
  if (sVar5 == 0) {
    fconfig_00 = (fdb_kvs_handle *)&fStack_10348;
    pfStack_104d0 = (fdb_kvs_handle *)0x110055;
    fdb_get_default_config();
    pfVar11 = (fdb_config *)(auStack_10488 + 0x48);
    pfStack_104d0 = (fdb_kvs_handle *)0x11006d;
    memcpy(pfVar11,fconfig_00,0xf8);
    pdStack_10438 = (docio_handle *)0xffffffffffffffff;
    pfStack_104d0 = (fdb_kvs_handle *)0x110087;
    fVar2 = fdb_open(&pfStack_104c8,"./dummy1",pfVar11);
    if (fVar2 != FDB_RESULT_TOO_BIG_BUFFER_CACHE) goto LAB_001102ee;
    fconfig_00 = (fdb_kvs_handle *)&fStack_10348;
    pfStack_104d0 = (fdb_kvs_handle *)0x1100a0;
    fdb_get_default_config();
    pfVar11 = (fdb_config *)(auStack_10488 + 0x48);
    pfStack_104d0 = (fdb_kvs_handle *)0x1100b8;
    memcpy(pfVar11,fconfig_00,0xf8);
    uStack_103d0 = 0x78;
    pfStack_104d0 = (fdb_kvs_handle *)0x1100d2;
    fVar2 = fdb_open(&pfStack_104c8,"./dummy1",pfVar11);
    if (fVar2 != FDB_RESULT_INVALID_CONFIG) goto LAB_001102f3;
    pfVar11 = &fStack_10348;
    pfStack_104d0 = (fdb_kvs_handle *)0x1100eb;
    fdb_get_default_config();
    pfStack_104d0 = (fdb_kvs_handle *)0x110100;
    memcpy(auStack_10488 + 0x48,pfVar11,0xf8);
    pfStack_104d0 = (fdb_kvs_handle *)0x11010a;
    fdb_get_default_kvs_config();
    unaff_RBP = 4;
    unaff_R15 = "justonekv";
    unaff_R12 = &pfStack_104b8;
    unaff_R13 = (fdb_kvs_handle *)auStack_10488;
    do {
      pfStack_104d0 = (fdb_kvs_handle *)0x110133;
      sprintf((char *)pfVar11,"dummy%d",unaff_RBP);
      pfStack_104d0 = (fdb_kvs_handle *)0x110146;
      fVar2 = fdb_open(&pfStack_104c8,(char *)pfVar11,(fdb_config *)(auStack_10488 + 0x48));
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_001102da:
        pfStack_104d0 = (fdb_kvs_handle *)0x1102df;
        config_test();
LAB_001102df:
        pfStack_104d0 = (fdb_kvs_handle *)0x1102e4;
        config_test();
LAB_001102e4:
        pfStack_104d0 = (fdb_kvs_handle *)0x1102e9;
        config_test();
        goto LAB_001102e9;
      }
      pfStack_104d0 = (fdb_kvs_handle *)0x110162;
      fVar2 = fdb_kvs_open(pfStack_104c8,unaff_R12,"justonekv",&fStack_104b0);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_104d0 = (fdb_kvs_handle *)0x1102da;
        config_test();
        goto LAB_001102da;
      }
      pfStack_104d0 = (fdb_kvs_handle *)0x11016f;
      fconfig_00 = (fdb_kvs_handle *)fdb_get_buffer_cache_used();
      pfStack_104d0 = (fdb_kvs_handle *)0x11017e;
      fVar2 = fdb_get_file_info(pfStack_104c8,(fdb_file_info *)unaff_R13);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001102e4;
      iVar3 = iStack_1043c;
      if ((fdb_file_handle *)auStack_10488._40_8_ !=
          (fdb_file_handle *)(ulong)(uint)(iStack_1043c * 7)) {
        pfStack_104d0 = (fdb_kvs_handle *)0x1101d6;
        config_test();
        iVar3 = iStack_104bc;
      }
      if (fconfig_00 != (fdb_kvs_handle *)(ulong)(uint)(iVar3 * 2)) {
        pfStack_104d0 = (fdb_kvs_handle *)0x1101ec;
        config_test();
      }
      pfStack_104d0 = (fdb_kvs_handle *)0x1101ad;
      fVar2 = fdb_close(pfStack_104c8);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001102df;
      uVar7 = (int)unaff_RBP - 1;
      unaff_RBP = (ulong)uVar7;
    } while (uVar7 != 0);
    pfStack_104d0 = (fdb_kvs_handle *)0x110206;
    fVar2 = fdb_open(&pfStack_104c8,(char *)&fStack_10348,(fdb_config *)(auStack_10488 + 0x48));
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001102f8;
    pfStack_104d0 = (fdb_kvs_handle *)0x110228;
    fVar2 = fdb_kvs_open(pfStack_104c8,&pfStack_104b8,"justonekv",&fStack_104b0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001102fd;
    pfStack_104d0 = (fdb_kvs_handle *)0x110253;
    fVar2 = fdb_set_kv(pfStack_104b8,"key",3,"body",5);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_104d0 = (fdb_kvs_handle *)0x110260;
      sVar5 = fdb_get_buffer_cache_used();
      if (sVar5 != (uint)(iStack_1043c << 3)) {
        pfStack_104d0 = (fdb_kvs_handle *)0x11027f;
        config_test();
      }
      pfStack_104d0 = (fdb_kvs_handle *)0x110288;
      fdb_close(pfStack_104c8);
      pfStack_104d0 = (fdb_kvs_handle *)0x11028d;
      fdb_shutdown();
      pfStack_104d0 = (fdb_kvs_handle *)0x110292;
      memleak_end();
      pcVar8 = "%s PASSED\n";
      if (config_test()::__test_pass != '\0') {
        pcVar8 = "%s FAILED\n";
      }
      pfStack_104d0 = (fdb_kvs_handle *)0x1102c3;
      fprintf(_stderr,pcVar8,"forestdb config test");
      return;
    }
  }
  else {
LAB_001102e9:
    pfStack_104d0 = (fdb_kvs_handle *)0x1102ee;
    config_test();
LAB_001102ee:
    pfStack_104d0 = (fdb_kvs_handle *)0x1102f3;
    config_test();
LAB_001102f3:
    pfStack_104d0 = (fdb_kvs_handle *)0x1102f8;
    config_test();
LAB_001102f8:
    pfStack_104d0 = (fdb_kvs_handle *)0x1102fd;
    config_test();
LAB_001102fd:
    pfStack_104d0 = (fdb_kvs_handle *)0x110302;
    config_test();
  }
  pfStack_104d0 = (fdb_kvs_handle *)delete_reopen_test;
  config_test();
  pfStack_10608 = (fdb_config *)0x11031b;
  pfStack_104d0 = fconfig_00;
  gettimeofday(&tStack_105d8,(__timezone_ptr_t)0x0);
  pfStack_10608 = (fdb_config *)0x110320;
  memleak_start();
  pfStack_10608 = (fdb_config *)0x11032c;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_10608 = (fdb_config *)0x110339;
  fdb_get_default_config();
  fStack_105c8.buffercache_size = 0;
  fStack_105c8.num_compactor_threads = 1;
  pfStack_10608 = (fdb_config *)0x11035d;
  fVar2 = fdb_open(&pfStack_105f8,"./dummy3",&fStack_105c8);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfStack_10608 = (fdb_config *)0x110376;
    fVar2 = fdb_kvs_open_default(pfStack_105f8,&pfStack_105f0,(fdb_kvs_config *)0x0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011056d;
    pfStack_10608 = (fdb_config *)0x11038d;
    fVar2 = fdb_begin_transaction(pfStack_105f8,'\x02');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110572;
    pfStack_10608 = (fdb_config *)0x1103b8;
    fVar2 = fdb_set_kv(pfStack_105f0,"foo",3,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110577;
    pfStack_10608 = (fdb_config *)0x1103cc;
    fVar2 = fdb_end_transaction(pfStack_105f8,'\0');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011057c;
    pfStack_10608 = (fdb_config *)0x1103f4;
    fVar2 = fdb_get_kv(pfStack_105f0,"foo",3,&piStack_105e0,&sStack_105e8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110581;
    if (sStack_105e8 != 5) {
      pfStack_10608 = (fdb_config *)0x11040e;
      delete_reopen_test();
    }
    if ((char)piStack_105e0[1] != 'e' || *piStack_105e0 != 0x756c6176) goto LAB_00110586;
    pfStack_10608 = (fdb_config *)0x11042e;
    fdb_free_block(piStack_105e0);
    pfStack_10608 = (fdb_config *)0x11043d;
    fVar2 = fdb_begin_transaction(pfStack_105f8,'\x02');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011058b;
    pfStack_10608 = (fdb_config *)0x11045b;
    fVar2 = fdb_del_kv(pfStack_105f0,"foo",3);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110590;
    pfStack_10608 = (fdb_config *)0x11046f;
    fVar2 = fdb_end_transaction(pfStack_105f8,'\0');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110595;
    pfStack_10608 = (fdb_config *)0x110497;
    fVar2 = fdb_get_kv(pfStack_105f0,"foo",3,&piStack_105e0,&sStack_105e8);
    if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0011059a;
    pfStack_10608 = (fdb_config *)0x1104aa;
    fVar2 = fdb_close(pfStack_105f8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011059f;
    pfStack_10608 = (fdb_config *)0x1104c8;
    fVar2 = fdb_open(&pfStack_105f8,"./dummy3",&fStack_105c8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001105a4;
    pfStack_10608 = (fdb_config *)0x1104e1;
    fVar2 = fdb_kvs_open_default(pfStack_105f8,&pfStack_105f0,(fdb_kvs_config *)0x0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001105a9;
    pfStack_10608 = (fdb_config *)0x110509;
    fVar2 = fdb_get_kv(pfStack_105f0,"foo",3,&piStack_105e0,&sStack_105e8);
    if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001105ae;
    pfStack_10608 = (fdb_config *)0x11051c;
    fVar2 = fdb_close(pfStack_105f8);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_10608 = (fdb_config *)0x110529;
      fdb_shutdown();
      pfStack_10608 = (fdb_config *)0x11052e;
      memleak_end();
      pcVar8 = "%s PASSED\n";
      if (delete_reopen_test()::__test_pass != '\0') {
        pcVar8 = "%s FAILED\n";
      }
      pfStack_10608 = (fdb_config *)0x11055f;
      fprintf(_stderr,pcVar8,"end trans delete & reopen passed");
      return;
    }
  }
  else {
    pfStack_10608 = (fdb_config *)0x11056d;
    delete_reopen_test();
LAB_0011056d:
    pfStack_10608 = (fdb_config *)0x110572;
    delete_reopen_test();
LAB_00110572:
    pfStack_10608 = (fdb_config *)0x110577;
    delete_reopen_test();
LAB_00110577:
    pfStack_10608 = (fdb_config *)0x11057c;
    delete_reopen_test();
LAB_0011057c:
    pfStack_10608 = (fdb_config *)0x110581;
    delete_reopen_test();
LAB_00110581:
    pfStack_10608 = (fdb_config *)0x110586;
    delete_reopen_test();
LAB_00110586:
    pfStack_10608 = (fdb_config *)0x11058b;
    delete_reopen_test();
LAB_0011058b:
    pfStack_10608 = (fdb_config *)0x110590;
    delete_reopen_test();
LAB_00110590:
    pfStack_10608 = (fdb_config *)0x110595;
    delete_reopen_test();
LAB_00110595:
    pfStack_10608 = (fdb_config *)0x11059a;
    delete_reopen_test();
LAB_0011059a:
    pfStack_10608 = (fdb_config *)0x11059f;
    delete_reopen_test();
LAB_0011059f:
    pfStack_10608 = (fdb_config *)0x1105a4;
    delete_reopen_test();
LAB_001105a4:
    pfStack_10608 = (fdb_config *)0x1105a9;
    delete_reopen_test();
LAB_001105a9:
    pfStack_10608 = (fdb_config *)0x1105ae;
    delete_reopen_test();
LAB_001105ae:
    pfStack_10608 = (fdb_config *)0x1105b3;
    delete_reopen_test();
  }
  pfStack_10608 = (fdb_config *)deleted_doc_get_api_test;
  delete_reopen_test();
  pfStack_109c0 = (fdb_config *)0x1105d1;
  pfStack_10610 = &fStack_105c8;
  pfStack_10608 = pfVar11;
  gettimeofday(&tStack_10918,(__timezone_ptr_t)0x0);
  pfStack_109c0 = (fdb_config *)0x1105d6;
  memleak_start();
  pfStack_109c0 = (fdb_config *)0x1105e2;
  system("rm -rf  dummy* > errorlog.txt");
  pvStack_10940 = (void *)0x0;
  auStack_10988._0_8_ = 0;
  auStack_10988._8_8_ = 0;
  auStack_10988._16_8_ = 0;
  auStack_10988._24_8_ = 0;
  uStack_10958 = 0;
  p_Stack_10950 = (fdb_compaction_callback)0x0;
  auStack_10988._32_8_ = auStack_10908;
  pfStack_10948 = &fStack_10808;
  fStack_10960 = 0xffffffffffffffff;
  pfVar6 = &fStack_10708;
  pfStack_109c0 = (fdb_config *)0x110631;
  fdb_get_default_config();
  fStack_10708.purging_interval = 1;
  fStack_10708.seqtree_opt = '\x01';
  pfStack_109c0 = (fdb_config *)0x110649;
  fdb_get_default_kvs_config();
  pfStack_109c0 = (fdb_config *)0x11065d;
  fVar2 = fdb_open(&pfStack_10998,"./dummy1",pfVar6);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfStack_109c0 = (fdb_config *)0x11067e;
    fVar2 = fdb_kvs_open(pfStack_10998,&pfStack_109a0,(char *)0x0,&fStack_10930);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108c7;
    builtin_memcpy(auStack_10908,"key",4);
    pfVar6 = &fStack_10808;
    fStack_10808.chunksize = 0x6f62;
    fStack_10808._2_2_ = 0x7964;
    fStack_10808.blocksize._0_1_ = 0;
    pfStack_109c0 = (fdb_config *)0x1106ab;
    auStack_10988._0_8_ = strlen((char *)auStack_10908);
    pfVar11 = (fdb_config *)auStack_10988;
    pfStack_109c0 = (fdb_config *)0x1106bb;
    auStack_10988._16_8_ = strlen((char *)pfVar6);
    pfStack_109c0 = (fdb_config *)0x1106cc;
    fVar2 = fdb_set(pfStack_109a0,(fdb_doc *)pfVar11);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108cc;
    pfStack_109c0 = (fdb_config *)0x1106e3;
    fVar2 = fdb_commit(pfStack_10998,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108d1;
    pfStack_109c0 = (fdb_config *)0x1106fa;
    fVar2 = fdb_del(pfStack_109a0,(fdb_doc *)auStack_10988);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108d6;
    pfStack_109c0 = (fdb_config *)0x110711;
    fVar2 = fdb_commit(pfStack_10998,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108db;
    pfVar6 = (fdb_config *)&pfStack_109a8;
    pfStack_109c0 = (fdb_config *)0x110743;
    fdb_doc_create((fdb_doc **)pfVar6,auStack_10908,auStack_10988._0_8_,(void *)0x0,0,(void *)0x0,0)
    ;
    pfStack_109c0 = (fdb_config *)0x110750;
    fVar2 = fdb_get_metaonly(pfStack_109a0,pfStack_109a8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108e0;
    pfVar9 = pfStack_109a8;
    if (pfStack_109a8->deleted == false) {
      pfVar6 = (fdb_config *)&pfStack_10990;
      pfStack_109c0 = (fdb_config *)0x110775;
      deleted_doc_get_api_test();
      pfVar9 = pfStack_10990;
    }
    pfVar9->deleted = false;
    pfStack_109c0 = (fdb_config *)0x110786;
    fVar2 = fdb_get_metaonly_byseq(pfStack_109a0,pfVar9);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108e5;
    pfVar9 = pfStack_109a8;
    if (pfStack_109a8->deleted == false) {
      pfVar6 = (fdb_config *)&pfStack_10990;
      pfStack_109c0 = (fdb_config *)0x1107ab;
      deleted_doc_get_api_test();
      pfVar9 = pfStack_10990;
    }
    pfVar9->deleted = false;
    pfStack_109c0 = (fdb_config *)0x1107bc;
    fVar2 = fdb_get_byoffset(pfStack_109a0,pfVar9);
    if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001108ea;
    pfVar9 = pfStack_109a8;
    if (pfStack_109a8->deleted == false) {
      pfVar6 = (fdb_config *)&pfStack_10990;
      pfStack_109c0 = (fdb_config *)0x1107e2;
      deleted_doc_get_api_test();
      pfVar9 = pfStack_10990;
    }
    pfVar9->deleted = false;
    pfStack_109c0 = (fdb_config *)0x1107f3;
    fVar2 = fdb_get(pfStack_109a0,pfVar9);
    if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001108ef;
    pfVar9 = pfStack_109a8;
    if (pfStack_109a8->deleted == true) {
      pfVar6 = (fdb_config *)&pfStack_10990;
      pfStack_109c0 = (fdb_config *)0x110819;
      deleted_doc_get_api_test();
      pfVar9 = pfStack_10990;
    }
    pfVar9->deleted = false;
    pfStack_109c0 = (fdb_config *)0x11082a;
    fVar2 = fdb_get_byseq(pfStack_109a0,pfVar9);
    if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001108f4;
    if (pfStack_109a8->deleted == true) {
      pfVar6 = (fdb_config *)&pfStack_10990;
      pfStack_109c0 = (fdb_config *)0x110850;
      deleted_doc_get_api_test();
      pfStack_109a8 = pfStack_10990;
    }
    pfStack_109c0 = (fdb_config *)0x110858;
    fdb_doc_free(pfStack_109a8);
    pfStack_109c0 = (fdb_config *)0x110862;
    fVar2 = fdb_kvs_close(pfStack_109a0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108f9;
    pfStack_109c0 = (fdb_config *)0x110874;
    fVar2 = fdb_close(pfStack_10998);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_109c0 = (fdb_config *)0x110881;
      fdb_shutdown();
      pfStack_109c0 = (fdb_config *)0x110886;
      memleak_end();
      pcVar8 = "%s PASSED\n";
      if (deleted_doc_get_api_test()::__test_pass != '\0') {
        pcVar8 = "%s FAILED\n";
      }
      pfStack_109c0 = (fdb_config *)0x1108b7;
      fprintf(_stderr,pcVar8,"deleted doc get api test");
      return;
    }
  }
  else {
    pfStack_109c0 = (fdb_config *)0x1108c7;
    deleted_doc_get_api_test();
LAB_001108c7:
    pfStack_109c0 = (fdb_config *)0x1108cc;
    deleted_doc_get_api_test();
LAB_001108cc:
    pfStack_109c0 = (fdb_config *)0x1108d1;
    deleted_doc_get_api_test();
LAB_001108d1:
    pfStack_109c0 = (fdb_config *)0x1108d6;
    deleted_doc_get_api_test();
LAB_001108d6:
    pfStack_109c0 = (fdb_config *)0x1108db;
    deleted_doc_get_api_test();
LAB_001108db:
    pfStack_109c0 = (fdb_config *)0x1108e0;
    deleted_doc_get_api_test();
LAB_001108e0:
    pfStack_109c0 = (fdb_config *)0x1108e5;
    deleted_doc_get_api_test();
LAB_001108e5:
    pfStack_109c0 = (fdb_config *)0x1108ea;
    deleted_doc_get_api_test();
LAB_001108ea:
    pfStack_109c0 = (fdb_config *)0x1108ef;
    deleted_doc_get_api_test();
LAB_001108ef:
    pfStack_109c0 = (fdb_config *)0x1108f4;
    deleted_doc_get_api_test();
LAB_001108f4:
    pfStack_109c0 = (fdb_config *)0x1108f9;
    deleted_doc_get_api_test();
LAB_001108f9:
    pfStack_109c0 = (fdb_config *)0x1108fe;
    deleted_doc_get_api_test();
  }
  pfStack_109c0 = (fdb_config *)deleted_doc_stat_test;
  deleted_doc_get_api_test();
  pcStack_10da8 = (code *)0x11091c;
  pfStack_109c8 = pfVar6;
  pfStack_109c0 = pfVar11;
  gettimeofday(&tStack_10d18,(__timezone_ptr_t)0x0);
  pcStack_10da8 = (code *)0x110921;
  memleak_start();
  pcStack_10da8 = (code *)0x11092d;
  system("rm -rf  dummy* > errorlog.txt");
  auStack_10d80._24_8_ = 0;
  pvStack_10d48 = (void *)0x0;
  uStack_10d50 = 0;
  auStack_10d80._8_8_ = 0;
  auStack_10d80._16_8_ = 0;
  uStack_10d38 = 0;
  auStack_10d80._32_8_ = acStack_10bc0;
  pfStack_10d40 = &fStack_10cc0;
  fStack_10d58 = 0xffffffffffffffff;
  pfVar6 = &fStack_10ac0;
  pcStack_10da8 = (code *)0x110980;
  fdb_get_default_config();
  fStack_10ac0.purging_interval = 0;
  pcStack_10da8 = (code *)0x110991;
  fdb_get_default_kvs_config();
  pcStack_10da8 = (code *)0x1109a5;
  fVar2 = fdb_open(&pfStack_10d98,"./dummy1",pfVar6);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_10da8 = (code *)0x1109c8;
    fVar2 = fdb_kvs_open(pfStack_10d98,&pfStack_10d90,"main",&fStack_10d30);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110b48;
    acStack_10bc0[0] = 'K';
    acStack_10bc0[1] = '\0';
    pfVar6 = &fStack_10cc0;
    fStack_10cc0.chunksize = 0x6f62;
    fStack_10cc0._2_2_ = 0x7964;
    fStack_10cc0.blocksize._0_1_ = 0;
    pcStack_10da8 = (code *)0x1109f4;
    sVar4 = strlen(acStack_10bc0);
    auStack_10d80._0_8_ = sVar4 + 1;
    pfVar11 = (fdb_config *)auStack_10d80;
    pcStack_10da8 = (code *)0x110a07;
    sVar4 = strlen((char *)pfVar6);
    auStack_10d80._16_8_ = sVar4 + 1;
    pcStack_10da8 = (code *)0x110a1b;
    fVar2 = fdb_set(pfStack_10d90,(fdb_doc *)pfVar11);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110b4d;
    pcStack_10da8 = (code *)0x110a32;
    fVar2 = fdb_del(pfStack_10d90,(fdb_doc *)auStack_10d80);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110b52;
    pfVar6 = (fdb_config *)&pfStack_10d88;
    pcStack_10da8 = (code *)0x110a61;
    fdb_doc_create((fdb_doc **)pfVar6,(void *)auStack_10d80._32_8_,auStack_10d80._0_8_,(void *)0x0,0
                   ,(void *)0x0,0);
    pcStack_10da8 = (code *)0x110a6e;
    fVar2 = fdb_get(pfStack_10d90,pfStack_10d88);
    if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_00110b57;
    pcStack_10da8 = (code *)0x110a81;
    fdb_doc_free(pfStack_10d88);
    pcStack_10da8 = (code *)0x110a93;
    fdb_get_file_info(pfStack_10d98,(fdb_file_info *)auStack_10d08);
    pfVar6 = (fdb_config *)(auStack_10d08 + 0x10);
    if (auStack_10d08._16_8_ != 0) {
      pcStack_10da8 = (code *)0x110aa9;
      deleted_doc_stat_test();
    }
    pcStack_10da8 = (code *)0x110ab5;
    fVar2 = fdb_commit(pfStack_10d98,'\0');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110b5c;
    pfVar11 = (fdb_config *)auStack_10d08;
    pcStack_10da8 = (code *)0x110ad2;
    fdb_get_file_info(pfStack_10d98,(fdb_file_info *)pfVar11);
    if (auStack_10d08._16_8_ != 0) {
      pcStack_10da8 = (code *)0x110ae1;
      deleted_doc_stat_test();
    }
    pcStack_10da8 = (code *)0x110aeb;
    fVar2 = fdb_kvs_close(pfStack_10d90);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110b61;
    pcStack_10da8 = (code *)0x110af9;
    fVar2 = fdb_close(pfStack_10d98);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_10da8 = (code *)0x110b02;
      fdb_shutdown();
      pcStack_10da8 = (code *)0x110b07;
      memleak_end();
      pcVar8 = "%s PASSED\n";
      if (deleted_doc_stat_test()::__test_pass != '\0') {
        pcVar8 = "%s FAILED\n";
      }
      pcStack_10da8 = (code *)0x110b38;
      fprintf(_stderr,pcVar8,"deleted doc stat test");
      return;
    }
  }
  else {
    pcStack_10da8 = (code *)0x110b48;
    deleted_doc_stat_test();
LAB_00110b48:
    pcStack_10da8 = (code *)0x110b4d;
    deleted_doc_stat_test();
LAB_00110b4d:
    pcStack_10da8 = (code *)0x110b52;
    deleted_doc_stat_test();
LAB_00110b52:
    pcStack_10da8 = (code *)0x110b57;
    deleted_doc_stat_test();
LAB_00110b57:
    pcStack_10da8 = (code *)0x110b5c;
    deleted_doc_stat_test();
LAB_00110b5c:
    pcStack_10da8 = (code *)0x110b61;
    deleted_doc_stat_test();
LAB_00110b61:
    pcStack_10da8 = (code *)0x110b66;
    deleted_doc_stat_test();
  }
  pcStack_10da8 = complete_delete_test;
  deleted_doc_stat_test();
  pcStack_11230 = (code *)0x110b88;
  pfStack_10dd0 = pfVar6;
  ppfStack_10dc8 = unaff_R12;
  pfStack_10dc0 = unaff_R13;
  pfStack_10db8 = pfVar11;
  pcStack_10db0 = unaff_R15;
  pcStack_10da8 = (code *)unaff_RBP;
  gettimeofday(&tStack_11200,(__timezone_ptr_t)0x0);
  pcStack_11230 = (code *)0x110b8d;
  memleak_start();
  pcVar8 = acStack_10ed8;
  builtin_strncpy(acStack_10ed8,"./dummy1",9);
  pcStack_11230 = (code *)0x110bb2;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar11 = &fStack_10fd0;
  pcStack_11230 = (code *)0x110bc2;
  fdb_get_default_config();
  fStack_10fd0.buffercache_size = 0;
  kvs_config_00 = &fStack_111f0.create_if_missing;
  pcStack_11230 = (code *)0x110bd7;
  fdb_get_default_kvs_config();
  ptr_fhandle = &pfStack_11210;
  pcStack_11230 = (code *)0x110bea;
  fdb_open(ptr_fhandle,pcVar8,pfVar11);
  pcStack_11230 = (code *)0x110c02;
  fVar2 = fdb_kvs_open(pfStack_11210,&pfStack_11218,"db1",(fdb_kvs_config *)kvs_config_00);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110d9c;
  unaff_RBP = 0;
  do {
    pcStack_11230 = (code *)0x110c33;
    sprintf((char *)&fStack_110d8,"key%05d",unaff_RBP);
    pcStack_11230 = (code *)0x110c42;
    sprintf((char *)apfStack_111d8,"value%05d",unaff_RBP);
    unaff_R13 = pfStack_11218;
    pcStack_11230 = (code *)0x110c4f;
    sVar4 = strlen((char *)&fStack_110d8);
    pcVar8 = (char *)(sVar4 + 1);
    pcStack_11230 = (code *)0x110c5b;
    sVar4 = strlen((char *)apfStack_111d8);
    pcStack_11230 = (code *)0x110c70;
    fVar2 = fdb_set_kv(unaff_R13,&fStack_110d8,(size_t)pcVar8,apfStack_111d8,sVar4 + 1);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStack_11230 = (code *)0x110d97;
      complete_delete_test();
      goto LAB_00110d97;
    }
    uVar7 = (int)unaff_RBP + 1;
    unaff_RBP = (ulong)uVar7;
  } while (uVar7 != 1000);
  pcStack_11230 = (code *)0x110c91;
  fdb_commit(pfStack_11210,'\x01');
  pcVar8 = "key%05d";
  pfVar11 = &fStack_110d8;
  kvs_config_00 = "value%05d";
  ptr_fhandle = apfStack_111d8;
  unaff_RBP = 0;
  do {
    pcStack_11230 = (code *)0x110cbd;
    sprintf((char *)pfVar11,"key%05d",unaff_RBP);
    pcStack_11230 = (code *)0x110ccc;
    sprintf((char *)ptr_fhandle,"value%05d",unaff_RBP);
    unaff_R13 = pfStack_11218;
    pcStack_11230 = (code *)0x110cd9;
    sVar4 = strlen((char *)pfVar11);
    pcStack_11230 = (code *)0x110ce8;
    fVar2 = fdb_del_kv(unaff_R13,pfVar11,sVar4 + 1);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110d97;
    uVar7 = (int)unaff_RBP + 1;
    unaff_RBP = (ulong)uVar7;
  } while (uVar7 != 1000);
  pcStack_11230 = (code *)0x110d09;
  fdb_commit(pfStack_11210,'\x01');
  pcStack_11230 = (code *)0x110d29;
  fVar2 = fdb_iterator_init(pfStack_11218,&pfStack_11208,(void *)0x0,0,(void *)0x0,0,2);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110da1;
  pcStack_11230 = (code *)0x110d37;
  fVar2 = fdb_iterator_close(pfStack_11208);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_11230 = (code *)0x110d45;
    fdb_close(pfStack_11210);
    pcStack_11230 = (code *)0x110d4a;
    fdb_shutdown();
    pcStack_11230 = (code *)0x110d4f;
    memleak_end();
    pcVar8 = "%s PASSED\n";
    if (complete_delete_test()::__test_pass != '\0') {
      pcVar8 = "%s FAILED\n";
    }
    pcStack_11230 = (code *)0x110d80;
    fprintf(_stderr,pcVar8,"complete delete");
    return;
  }
  goto LAB_00110da6;
LAB_00110d97:
  pfVar11 = &fStack_110d8;
  ptr_fhandle = apfStack_111d8;
  kvs_config_00 = "value%05d";
  pcStack_11230 = (code *)0x110d9c;
  complete_delete_test();
LAB_00110d9c:
  pcStack_11230 = (code *)0x110da1;
  complete_delete_test();
LAB_00110da1:
  pcStack_11230 = (code *)0x110da6;
  complete_delete_test();
LAB_00110da6:
  pcStack_11230 = large_batch_write_no_commit_test;
  complete_delete_test();
  pfStack_116a8 = (fdb_config *)0x110dc8;
  pcStack_11258 = pcVar8;
  ppfStack_11250 = ptr_fhandle;
  pfStack_11248 = unaff_R13;
  pfStack_11240 = pfVar11;
  pfStack_11238 = (fdb_kvs_config *)kvs_config_00;
  pcStack_11230 = (code *)unaff_RBP;
  gettimeofday(&tStack_11670,(__timezone_ptr_t)0x0);
  pfStack_116a8 = (fdb_config *)0x110dcd;
  memleak_start();
  pfStack_116a8 = (fdb_config *)0x110dd7;
  pfVar6 = (fdb_config *)malloc(4000000);
  pfStack_116a8 = (fdb_config *)0x110de6;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar11 = &fStack_11558;
  pfStack_116a8 = (fdb_config *)0x110df6;
  fdb_get_default_config();
  pfStack_116a8 = (fdb_config *)0x110e00;
  fdb_get_default_kvs_config();
  pfStack_116a8 = (fdb_config *)0x110e14;
  fVar2 = fdb_open(&pfStack_11698,"./dummy1",pfVar11);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfStack_116a8 = (fdb_config *)0x110e32;
    fVar2 = fdb_kvs_open(pfStack_11698,&pfStack_11690,(char *)0x0,&fStack_11688);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110fb7;
    pcVar8 = (char *)0x0;
    uVar10 = 0;
    do {
      pfStack_116a8 = (fdb_config *)0x110e5b;
      sprintf(acStack_11360,"key%128d",uVar10 & 0xffffffff);
      pfStack_116a8 = (fdb_config *)0x110e77;
      sprintf(acStack_11460,"meta%128d",uVar10 & 0xffffffff);
      pfStack_116a8 = (fdb_config *)0x110e8d;
      sprintf(acStack_11660,"body%128d",uVar10 & 0xffffffff);
      pfStack_116a8 = (fdb_config *)0x110e99;
      sVar4 = strlen(acStack_11360);
      pfStack_116a8 = (fdb_config *)0x110ea7;
      metalen = strlen(acStack_11460);
      pfStack_116a8 = (fdb_config *)0x110eb4;
      bodylen = strlen(acStack_11660);
      pfStack_116a8 = (fdb_config *)0x110ede;
      fdb_doc_create((fdb_doc **)(pcVar8 + (long)&pfVar6->chunksize),acStack_11360,sVar4,
                     acStack_11460,metalen,acStack_11660,bodylen);
      pfStack_116a8 = (fdb_config *)0x110eec;
      fdb_set(pfStack_11690,*(fdb_doc **)(&pfVar6->chunksize + uVar10 * 4));
      pfStack_116a8 = (fdb_config *)0x110ef5;
      fdb_doc_free(*(fdb_doc **)(&pfVar6->chunksize + uVar10 * 4));
      uVar10 = uVar10 + 1;
      pcVar8 = pcVar8 + 8;
    } while (uVar10 != 500000);
    pfStack_116a8 = (fdb_config *)0x110f13;
    fVar2 = fdb_kvs_close(pfStack_11690);
    pfVar11 = pfVar6;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110fbc;
    pfStack_116a8 = (fdb_config *)0x110f25;
    fVar2 = fdb_close(pfStack_11698);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110fc1;
    pfStack_116a8 = (fdb_config *)0x110f46;
    fVar2 = fdb_open(&pfStack_11698,"./dummy1",&fStack_11558);
    if (fVar2 == FDB_RESULT_NO_DB_HEADERS) {
LAB_00110f5d:
      pfStack_116a8 = (fdb_config *)0x110f65;
      free(pfVar6);
      pfStack_116a8 = (fdb_config *)0x110f6a;
      fdb_shutdown();
      pfStack_116a8 = (fdb_config *)0x110f6f;
      memleak_end();
      pcVar8 = "%s PASSED\n";
      if (large_batch_write_no_commit_test()::__test_pass != '\0') {
        pcVar8 = "%s FAILED\n";
      }
      pfStack_116a8 = (fdb_config *)0x110fa0;
      fprintf(_stderr,pcVar8,"large batch write test with no commits");
      return;
    }
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_116a8 = (fdb_config *)0x110f59;
      fVar2 = fdb_close(pfStack_11698);
      if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_00110f5d;
      goto LAB_00110fcb;
    }
  }
  else {
    pfStack_116a8 = (fdb_config *)0x110fb7;
    large_batch_write_no_commit_test();
LAB_00110fb7:
    pfStack_116a8 = (fdb_config *)0x110fbc;
    large_batch_write_no_commit_test();
LAB_00110fbc:
    pfStack_116a8 = (fdb_config *)0x110fc1;
    large_batch_write_no_commit_test();
LAB_00110fc1:
    pfStack_116a8 = (fdb_config *)0x110fc6;
    large_batch_write_no_commit_test();
  }
  pfStack_116a8 = (fdb_config *)0x110fcb;
  large_batch_write_no_commit_test();
LAB_00110fcb:
  pfStack_116a8 = (fdb_config *)set_get_meta_test;
  large_batch_write_no_commit_test();
  pcStack_116b8 = pcVar8;
  pfStack_116b0 = pfVar11;
  pfStack_116a8 = pfVar6;
  gettimeofday(&tStack_118d8,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fStack_118b0.wal_threshold = 0x400;
  fStack_118b0.seqtree_opt = '\x01';
  fStack_118b0.purging_interval = 1;
  fStack_118b0.flags = 1;
  system("rm -rf  dummy* > errorlog.txt");
  fdb_open(&pfStack_118e0,"./dummy1",&fStack_118b0);
  fdb_kvs_open(pfStack_118e0,&pfStack_118e8,"db1",&fStack_118c8);
  sprintf(acStack_117b8,"key%d",0);
  sVar4 = strlen(acStack_117b8);
  fdb_doc_create(&pfStack_118f0,acStack_117b8,sVar4,(void *)0x0,0,(void *)0x0,0);
  fdb_set(pfStack_118e8,pfStack_118f0);
  fVar2 = fdb_get(pfStack_118e8,pfStack_118f0);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x345,"void set_get_meta_test()");
  }
  fVar2 = fdb_get_byoffset(pfStack_118e8,pfStack_118f0);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_get_metaonly(pfStack_118e8,pfStack_118f0);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fVar2 = fdb_get_metaonly_byseq(pfStack_118e8,pfStack_118f0);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        fdb_del(pfStack_118e8,pfStack_118f0);
        fVar2 = fdb_get(pfStack_118e8,pfStack_118f0);
        if (fVar2 == FDB_RESULT_KEY_NOT_FOUND) {
          if (pfStack_118f0->deleted == false) {
            __assert_fail("rdoc->deleted == true",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0x350,"void set_get_meta_test()");
          }
          fVar2 = fdb_get_metaonly(pfStack_118e8,pfStack_118f0);
          if (fVar2 == FDB_RESULT_SUCCESS) {
            if (pfStack_118f0->deleted == false) {
              __assert_fail("rdoc->deleted == true",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                            ,0x354,"void set_get_meta_test()");
            }
            fVar2 = fdb_get_metaonly_byseq(pfStack_118e8,pfStack_118f0);
            if (fVar2 == FDB_RESULT_SUCCESS) {
              if (pfStack_118f0->deleted != false) {
                fVar2 = fdb_get_byoffset(pfStack_118e8,pfStack_118f0);
                if (fVar2 == FDB_RESULT_KEY_NOT_FOUND) {
                  if (pfStack_118f0->deleted != false) {
                    fdb_doc_free(pfStack_118f0);
                    fdb_kvs_close(pfStack_118e8);
                    fdb_close(pfStack_118e0);
                    fdb_shutdown();
                    memleak_end();
                    pcVar8 = "%s PASSED\n";
                    if (set_get_meta_test()::__test_pass != '\0') {
                      pcVar8 = "%s FAILED\n";
                    }
                    fprintf(_stderr,pcVar8,"set get meta test");
                    return;
                  }
                }
                else {
                  set_get_meta_test();
                }
                __assert_fail("rdoc->deleted == true",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                              ,0x35c,"void set_get_meta_test()");
              }
            }
            else {
              set_get_meta_test();
            }
            __assert_fail("rdoc->deleted == true",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0x358,"void set_get_meta_test()");
          }
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0x353,"void set_get_meta_test()");
        }
      }
      else {
        set_get_meta_test();
      }
      __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x34f,"void set_get_meta_test()");
    }
  }
  else {
    set_get_meta_test();
  }
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x349,"void set_get_meta_test()");
}

Assistant:

void init_test()
{
    TEST_INIT();
    memleak_start();

    int r;
    fdb_status status;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();

    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    status = fdb_init(&fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_open(&dbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_close(dbfile);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_shutdown();
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    memleak_end();
    TEST_RESULT("init test");
}